

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::on_format_specs(format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>,_char,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                  *this,char *begin,char *end)

{
  type tVar1;
  char *in_RDX;
  basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char> *in_RDI;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_>
  handler;
  basic_format_specs<char> specs;
  custom_formatter<char,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  f;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *parse_ctx;
  basic_format_specs<char> *in_stack_ffffffffffffff58;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *in_stack_ffffffffffffff60;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_>
  *in_stack_ffffffffffffff78;
  format_specs *in_stack_ffffffffffffff80;
  context_type *in_stack_ffffffffffffff88;
  arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_stack_ffffffffffffff90;
  basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_stack_ffffffffffffffa0;
  custom_formatter<char,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_stack_ffffffffffffffa8;
  basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_stack_ffffffffffffffb0;
  arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_stack_ffffffffffffffb8;
  custom_formatter<char,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  local_30;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *local_28;
  char *local_20;
  iterator local_18;
  iterator local_8;
  
  local_20 = in_RDX;
  local_28 = internal::
             context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
             ::parse_context((context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
                              *)&(in_RDI->
                                 super_context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
                                 ).parse_context_.format_str_.size_);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
            (in_stack_ffffffffffffff60,(iterator)in_stack_ffffffffffffff58);
  internal::
  custom_formatter<char,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  ::custom_formatter(&local_30,
                     (basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>
                      *)&(in_RDI->
                         super_context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
                         ).parse_context_.format_str_.size_);
  tVar1 = visit_format_arg<fmt::v5::internal::custom_formatter<char,fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>>&,fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (tVar1) {
    local_8 = basic_parse_context<char,_fmt::v5::internal::error_handler>::begin
                        ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)0x271c11);
  }
  else {
    basic_format_specs<char>::basic_format_specs((basic_format_specs<char> *)in_RDI);
    internal::
    specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
    ::specs_handler((specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                     *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_RDI);
    basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
    ::type((basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
            *)&in_RDI[1].
               super_context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
               .parse_context_.next_arg_id_);
    internal::
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_>
    ::specs_checker((specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>_>
                     *)in_stack_ffffffffffffff60,
                    (specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                     *)in_stack_ffffffffffffff58,(type)((ulong)in_RDI >> 0x20));
    local_18 = internal::
               parse_format_specs<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>>>&>
                         ((char *)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                          in_stack_ffffffffffffff78);
    if ((local_18 == local_20) || (*local_18 != '}')) {
      internal::error_handler::on_error
                ((error_handler *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    }
    basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to
              (in_stack_ffffffffffffff60,(iterator)in_stack_ffffffffffffff58);
    arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
    ::arg_formatter(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>,fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    internal::
    context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
    ::advance_to((context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
                  *)&(in_RDI->
                     super_context_base<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_char>
                     ).parse_context_.format_str_.size_,(iterator *)&stack0xffffffffffffff80);
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

const Char *on_format_specs(const Char *begin, const Char *end) {
    auto &parse_ctx = context.parse_context();
    parse_ctx.advance_to(begin);
    internal::custom_formatter<Char, Context> f(context);
    if (visit_format_arg(f, arg))
      return parse_ctx.begin();
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    internal::specs_checker<specs_handler<Context>>
        handler(specs_handler<Context>(specs, context), arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}')
      on_error("missing '}' in format string");
    parse_ctx.advance_to(begin);
    context.advance_to(visit_format_arg(ArgFormatter(context, &specs), arg));
    return begin;
  }